

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioPluginUtil.cpp
# Opt level: O2

void __thiscall
FFTAnalyzer::ReadBuffer(FFTAnalyzer *this,float *buffer,int numsamples,bool readInputBuffer)

{
  float fVar1;
  uint uVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  float __x;
  float fVar6;
  
  if (1 < this->numSpectraReady) {
    uVar2 = this->spectrumSize;
    if ((int)uVar2 < numsamples) {
      numsamples = uVar2;
    }
    pfVar3 = (&this->ispec2)[(ulong)!readInputBuffer * 2];
    uVar4 = 0;
    uVar5 = (ulong)(uint)numsamples;
    if (numsamples < 1) {
      uVar5 = uVar4;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      __x = (float)(int)uVar4 * ((float)((int)uVar2 / 2 + -2) / (float)(int)(numsamples - 1));
      fVar6 = floorf(__x);
      fVar1 = pfVar3[(int)fVar6];
      buffer[uVar4] = (__x - (float)(int)fVar6) * (pfVar3[(long)(int)fVar6 + 1] - fVar1) + fVar1;
    }
    return;
  }
  memset(buffer,0,(long)numsamples << 2);
  return;
}

Assistant:

void FFTAnalyzer::ReadBuffer(float* buffer, int numsamples, bool readInputBuffer)
{
    if (!CanBeRead())
    {
        memset(buffer, 0, sizeof(float) * numsamples);
        return;
    }
    if (numsamples > spectrumSize)
        numsamples = spectrumSize;
    float* buf = (readInputBuffer) ? ispec2 : ospec2;
    float scale = (float)((spectrumSize / 2) - 2) / (float)(numsamples - 1);
    for (int n = 0; n < numsamples; n++)
    {
        float f = n * scale;
        int i = FastFloor(f);
        buffer[n] = buf[i] + (buf[i + 1] - buf[i]) * (f - i);
    }
}